

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::~TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this,void **vtt)

{
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  *in_RSI;
  void **in_RDI;
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  *this_00;
  
  *in_RDI = *(TPZReference **)
             &(in_RSI->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix;
  *(int64_t *)((long)in_RDI + *(long *)((long)*in_RDI + -0x60)) =
       (in_RSI->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fEquationFilter
       .fActiveEqs.fNElements;
  *(int64_t *)((long)in_RDI + *(long *)((long)*in_RDI + -0x68)) =
       (in_RSI->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fEquationFilter
       .fActiveEqs.fNAlloc;
  in_RDI[0x14] = (in_RSI->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                 fEquationFilter.fDestIndices._vptr_TPZVec;
  this_00 = in_RSI;
  TPZStack<TPZElementMatrix_*,_10>::~TPZStack((TPZStack<TPZElementMatrix_*,_10> *)0x1deae20);
  TPZStack<TPZElementMatrix_*,_10>::~TPZStack((TPZStack<TPZElementMatrix_*,_10> *)0x1deae31);
  TPZStack<long,_10>::~TPZStack((TPZStack<long,_10> *)0x1deae42);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)in_RSI);
  TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ::~TPZFrontStructMatrix(this_00,in_RDI);
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::~TPZParFrontStructMatrix()
{

}